

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O3

bin_mdef_t * bin_mdef_read_text(ps_config_t *config,char *filename)

{
  ph_rc_t **pppVar1;
  ciphone_t *pcVar2;
  phone_t *ppVar3;
  int16 *piVar4;
  int32 iVar5;
  int32 iVar6;
  int32 iVar7;
  int iVar8;
  mdef_t *m;
  bin_mdef_t *m_00;
  char **ppcVar9;
  size_t sVar10;
  mdef_entry_t *pmVar11;
  cd_tree_t *pcVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ph_lc_t *ppVar19;
  ulong uVar20;
  ph_rc_t *ppVar21;
  undefined8 uVar22;
  ph_lc_t *ppVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  
  m = mdef_init(filename,1);
  if (m == (mdef_t *)0x0) {
    return (bin_mdef_t *)0x0;
  }
  uVar27 = m->n_sen;
  if ((int)uVar27 < 0x10000) {
    uVar27 = m->n_sseq;
    if ((int)uVar27 < 0x10000) {
      uVar27 = m->n_ciphone;
      if ((int)uVar27 < 0x100) {
        m_00 = (bin_mdef_t *)
               __ckd_calloc__(1,0x78,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                              ,0x5f);
        m_00->refcnt = 1;
        iVar8 = m->n_ciphone;
        iVar5 = m->n_phone;
        iVar6 = m->n_emit_state;
        iVar7 = m->n_ci_sen;
        m_00->n_ciphone = m->n_ciphone;
        m_00->n_phone = iVar5;
        m_00->n_emit_state = iVar6;
        m_00->n_ci_sen = iVar7;
        iVar5 = m->n_tmat;
        m_00->n_sen = m->n_sen;
        m_00->n_tmat = iVar5;
        m_00->n_sseq = m->n_sseq;
        m_00->sseq = m->sseq;
        piVar4 = m->sen2cimap;
        m_00->cd2cisen = m->cd2cisen;
        m_00->sen2cimap = piVar4;
        m_00->n_ctx = 3;
        m_00->sil = (int)m->sil;
        m->sseq = (uint16 **)0x0;
        m->cd2cisen = (int16 *)0x0;
        m->sen2cimap = (int16 *)0x0;
        ppcVar9 = (char **)__ckd_calloc__((long)iVar8,8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                          ,0x76);
        m_00->ciname = ppcVar9;
        iVar8 = m_00->n_ciphone;
        uVar28 = 0;
        if (0 < (long)iVar8) {
          pcVar2 = m->ciphone;
          lVar15 = 0;
          do {
            sVar10 = strlen(*(char **)((long)&pcVar2->name + lVar15));
            uVar27 = (int)uVar28 + (int)sVar10 + 1;
            uVar28 = (ulong)uVar27;
            lVar15 = lVar15 + 0x10;
          } while ((long)iVar8 * 0x10 != lVar15);
          uVar28 = (ulong)(int)uVar27;
        }
        lVar15 = 1;
        pcVar13 = (char *)__ckd_calloc__(uVar28,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                         ,0x7a);
        *m_00->ciname = pcVar13;
        strcpy(*m_00->ciname,m->ciphone->name);
        if (1 < m_00->n_ciphone) {
          ppcVar9 = m_00->ciname;
          pcVar13 = *ppcVar9;
          lVar25 = 8;
          do {
            sVar10 = strlen(pcVar13);
            *(char **)((long)ppcVar9 + lVar25) = pcVar13 + sVar10 + 1;
            strcpy(*(char **)((long)m_00->ciname + lVar25),
                   *(char **)((long)&m->ciphone->name + lVar25 * 2));
            ppcVar9 = m_00->ciname;
            pcVar13 = *(char **)((long)ppcVar9 + lVar25);
            iVar8 = strcmp(*(char **)((long)ppcVar9 + lVar25 + -8),pcVar13);
            if (0 < iVar8) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                      ,0x83,"Phone names are not in sorted order, sorry.");
              bin_mdef_free(m_00);
              mdef_free(m);
              return (bin_mdef_t *)0x0;
            }
            lVar15 = lVar15 + 1;
            lVar25 = lVar25 + 8;
          } while (lVar15 < m_00->n_ciphone);
        }
        pmVar11 = (mdef_entry_t *)
                  __ckd_calloc__((long)m_00->n_phone,0xc,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                 ,0x8b);
        m_00->phone = pmVar11;
        if (0 < m->n_phone) {
          lVar15 = 8;
          lVar25 = 0;
          lVar16 = 0;
          lVar18 = 0;
          do {
            ppVar3 = m->phone;
            pmVar11 = m_00->phone;
            *(undefined8 *)((long)&pmVar11->ssid + lVar16) =
                 *(undefined8 *)((long)&ppVar3->ssid + lVar25);
            if (lVar18 < m_00->n_ciphone) {
              *(undefined1 *)((long)&pmVar11->info + lVar16) =
                   *(undefined1 *)((long)&m->ciphone->name + lVar15);
            }
            else {
              *(undefined1 *)((long)&pmVar11->info + lVar16) =
                   *(undefined1 *)((long)&ppVar3->wpos + lVar25);
              *(undefined1 *)((long)&m_00->phone->info + lVar16 + 1) =
                   *(undefined1 *)((long)&m->phone->ci + lVar25);
              *(undefined1 *)((long)&m_00->phone->info + lVar16 + 2) =
                   *(undefined1 *)((long)&m->phone->lc + lVar25);
              *(undefined1 *)((long)&m_00->phone->info + lVar16 + 3) =
                   *(undefined1 *)((long)&m->phone->rc + lVar25);
            }
            lVar18 = lVar18 + 1;
            lVar16 = lVar16 + 0xc;
            lVar25 = lVar25 + 0x14;
            lVar15 = lVar15 + 0x10;
          } while (lVar18 < m->n_phone);
        }
        uVar27 = m->n_ciphone;
        lVar15 = 0;
        uVar24 = 0;
        if (0 < (int)uVar27) {
          uVar24 = uVar27;
        }
        uVar28 = 0;
        uVar14 = 0;
        do {
          uVar17 = (uint)uVar28;
          if (0 < (int)uVar27) {
            uVar20 = 0;
            do {
              for (ppVar19 = m->wpos_ci_lclist[lVar15][uVar20]; ppVar23 = ppVar19,
                  ppVar19 != (ph_lc_t *)0x0; ppVar19 = ppVar19->next) {
                do {
                  pppVar1 = &ppVar23->rclist;
                  uVar14 = uVar14 + 1;
                  ppVar23 = (ph_lc_t *)*pppVar1;
                } while ((ph_lc_t *)*pppVar1 != (ph_lc_t *)0x0);
                uVar28 = (ulong)((int)uVar28 + 1);
              }
              uVar14 = uVar14 + 1;
              uVar17 = (int)uVar28 + 1;
              uVar28 = (ulong)uVar17;
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar27);
          }
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 1;
          uVar28 = (ulong)(uVar17 + 1);
        } while (lVar15 != 4);
        uVar26 = (ulong)(uVar24 * 4 + 4);
        lVar25 = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0xb5,"Allocating %d * %d bytes (%d KiB) for CD tree\n",(ulong)uVar14,8,
                (ulong)(long)(int)uVar14 >> 7 & 0x3fffffffffffff);
        m_00->n_cd_tree = uVar14;
        pcVar12 = (cd_tree_t *)
                  __ckd_calloc__((long)(int)uVar14,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                 ,0xb7);
        m_00->cd_tree = pcVar12;
        uVar20 = (ulong)(uint)m->n_ciphone;
        lVar15 = 4;
        do {
          pcVar12 = m_00->cd_tree;
          pcVar12[lVar25].ctx = (int16)lVar25;
          pcVar12[lVar25].n_down = (int16)uVar20;
          pcVar12[lVar25].c.pid = (int)lVar15;
          uVar20 = (ulong)(uint)m->n_ciphone;
          if (0 < m->n_ciphone) {
            lVar15 = (long)(int)lVar15;
            lVar16 = 0;
            do {
              pcVar12 = m_00->cd_tree;
              pcVar12[lVar15].ctx = (int16)lVar16;
              pcVar12[lVar15].c.pid = (int)uVar26;
              ppVar19 = m->wpos_ci_lclist[lVar25][lVar16];
              pcVar12 = m_00->cd_tree;
              if (ppVar19 != (ph_lc_t *)0x0) {
                uVar26 = (ulong)(int)uVar26;
                do {
                  pcVar12[uVar26].ctx = ppVar19->lc;
                  pcVar12[uVar26].c.pid = (int)uVar28;
                  ppVar21 = ppVar19->rclist;
                  pcVar12 = m_00->cd_tree;
                  if (ppVar21 != (ph_rc_t *)0x0) {
                    uVar28 = (ulong)(int)uVar28;
                    do {
                      pcVar12[uVar28].ctx = ppVar21->rc;
                      pcVar12[uVar28].n_down = 0;
                      pcVar12[uVar28].c = (anon_union_4_2_61eccf2c_for_c)ppVar21->pid;
                      pcVar12 = m_00->cd_tree;
                      pcVar12[uVar26].n_down = pcVar12[uVar26].n_down + 1;
                      uVar28 = uVar28 + 1;
                      ppVar21 = ppVar21->next;
                    } while (ppVar21 != (ph_rc_s *)0x0);
                  }
                  if (pcVar12[uVar26].n_down == 0) {
                    pcVar12[uVar26].c.pid = -1;
                    pcVar12 = m_00->cd_tree;
                  }
                  pcVar12[lVar15].n_down = pcVar12[lVar15].n_down + 1;
                  uVar26 = uVar26 + 1;
                  ppVar19 = ppVar19->next;
                } while (ppVar19 != (ph_lc_s *)0x0);
              }
              if (pcVar12[lVar15].n_down == 0) {
                pcVar12[lVar15].c.pid = -1;
              }
              lVar15 = lVar15 + 1;
              lVar16 = lVar16 + 1;
              uVar20 = (ulong)m->n_ciphone;
            } while (lVar16 < (long)uVar20);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        mdef_free(m);
        m_00->alloc_mode = BIN_MDEF_FROM_TEXT;
        return m_00;
      }
      pcVar13 = "Number of phones exceeds limit: %d > %d\n";
      lVar15 = 0x5a;
      uVar22 = 0xff;
      goto LAB_0011e503;
    }
    pcVar13 = "Number of senone sequences exceeds limit: %d > %d\n";
    lVar15 = 0x53;
  }
  else {
    pcVar13 = "Number of senones exceeds limit: %d > %d\n";
    lVar15 = 0x4d;
  }
  uVar22 = 0xffff;
LAB_0011e503:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
          ,lVar15,pcVar13,(ulong)uVar27,uVar22);
  mdef_free(m);
  return (bin_mdef_t *)0x0;
}

Assistant:

bin_mdef_t *
bin_mdef_read_text(ps_config_t *config, const char *filename)
{
    bin_mdef_t *bmdef;
    mdef_t *mdef;
    int i, nodes, ci_idx, lc_idx, rc_idx;
    int nchars;

    (void)config;

    if ((mdef = mdef_init((char *) filename, TRUE)) == NULL)
        return NULL;

    /* Enforce some limits.  */
    if (mdef->n_sen > BAD_SENID) {
        E_ERROR("Number of senones exceeds limit: %d > %d\n",
                mdef->n_sen, BAD_SENID);
        mdef_free(mdef);
        return NULL;
    }
    if (mdef->n_sseq > BAD_SSID) {
        E_ERROR("Number of senone sequences exceeds limit: %d > %d\n",
                mdef->n_sseq, BAD_SSID);
        mdef_free(mdef);
        return NULL;
    }
    /* We use uint8 for ciphones */
    if (mdef->n_ciphone > 255) {
        E_ERROR("Number of phones exceeds limit: %d > %d\n",
                mdef->n_ciphone, 255);
        mdef_free(mdef);
        return NULL;
    }

    bmdef = ckd_calloc(1, sizeof(*bmdef));
    bmdef->refcnt = 1;

    /* Easy stuff.  The mdef.c code has done the heavy lifting for us. */
    bmdef->n_ciphone = mdef->n_ciphone;
    bmdef->n_phone = mdef->n_phone;
    bmdef->n_emit_state = mdef->n_emit_state;
    bmdef->n_ci_sen = mdef->n_ci_sen;
    bmdef->n_sen = mdef->n_sen;
    bmdef->n_tmat = mdef->n_tmat;
    bmdef->n_sseq = mdef->n_sseq;
    bmdef->sseq = mdef->sseq;
    bmdef->cd2cisen = mdef->cd2cisen;
    bmdef->sen2cimap = mdef->sen2cimap;
    bmdef->n_ctx = 3;           /* Triphones only. */
    bmdef->sil = mdef->sil;
    mdef->sseq = NULL;          /* We are taking over this one. */
    mdef->cd2cisen = NULL;      /* And this one. */
    mdef->sen2cimap = NULL;     /* And this one. */

    /* Get the phone names.  If they are not sorted
     * ASCII-betically then we are in a world of hurt and
     * therefore will simply refuse to continue. */
    bmdef->ciname = ckd_calloc(bmdef->n_ciphone, sizeof(*bmdef->ciname));
    nchars = 0;
    for (i = 0; i < bmdef->n_ciphone; ++i)
        nchars += strlen(mdef->ciphone[i].name) + 1;
    bmdef->ciname[0] = ckd_calloc(nchars, 1);
    strcpy(bmdef->ciname[0], mdef->ciphone[0].name);
    for (i = 1; i < bmdef->n_ciphone; ++i) {
        assert(i > 0); /* No reason to imagine it wouldn't be, but... */
        bmdef->ciname[i] =
            bmdef->ciname[i - 1] + strlen(bmdef->ciname[i - 1]) + 1;
        strcpy(bmdef->ciname[i], mdef->ciphone[i].name);
        if (strcmp(bmdef->ciname[i - 1], bmdef->ciname[i]) > 0) {
            /* FIXME: there should be a solution to this, actually. */
            E_ERROR("Phone names are not in sorted order, sorry.");
            bin_mdef_free(bmdef);
            mdef_free(mdef);
            return NULL;
        }
    }

    /* Copy over phone information. */
    bmdef->phone = ckd_calloc(bmdef->n_phone, sizeof(*bmdef->phone));
    for (i = 0; i < mdef->n_phone; ++i) {
        bmdef->phone[i].ssid = mdef->phone[i].ssid;
        bmdef->phone[i].tmat = mdef->phone[i].tmat;
        if (i < bmdef->n_ciphone) {
            bmdef->phone[i].info.ci.filler = mdef->ciphone[i].filler;
        }
        else {
            bmdef->phone[i].info.cd.wpos = mdef->phone[i].wpos;
            bmdef->phone[i].info.cd.ctx[0] = mdef->phone[i].ci;
            bmdef->phone[i].info.cd.ctx[1] = mdef->phone[i].lc;
            bmdef->phone[i].info.cd.ctx[2] = mdef->phone[i].rc;
        }
    }

    /* Walk the wpos_ci_lclist once to find the total number of
     * nodes and the starting locations for each level. */
    nodes = lc_idx = ci_idx = rc_idx = 0;
    for (i = 0; i < N_WORD_POSN; ++i) {
        int j;
        for (j = 0; j < mdef->n_ciphone; ++j) {
            ph_lc_t *lc;

            for (lc = mdef->wpos_ci_lclist[i][j]; lc; lc = lc->next) {
                ph_rc_t *rc;
                for (rc = lc->rclist; rc; rc = rc->next) {
                    ++nodes;    /* RC node */
                }
                ++nodes;        /* LC node */
                ++rc_idx;       /* Start of RC nodes (after LC nodes) */
            }
            ++nodes;            /* CI node */
            ++lc_idx;           /* Start of LC nodes (after CI nodes) */
            ++rc_idx;           /* Start of RC nodes (after CI and LC nodes) */
        }
        ++nodes;                /* wpos node */
        ++ci_idx;               /* Start of CI nodes (after wpos nodes) */
        ++lc_idx;               /* Start of LC nodes (after CI nodes) */
        ++rc_idx;               /* STart of RC nodes (after wpos, CI, and LC nodes) */
    }
    E_INFO("Allocating %d * %d bytes (%d KiB) for CD tree\n",
           nodes, sizeof(*bmdef->cd_tree), 
           nodes * sizeof(*bmdef->cd_tree) / 1024);
    bmdef->n_cd_tree = nodes;
    bmdef->cd_tree = ckd_calloc(nodes, sizeof(*bmdef->cd_tree));
    for (i = 0; i < N_WORD_POSN; ++i) {
        int j;

        bmdef->cd_tree[i].ctx = i;
        bmdef->cd_tree[i].n_down = mdef->n_ciphone;
        bmdef->cd_tree[i].c.down = ci_idx;
#if 0
        E_INFO("%d => %c (%d@%d)\n",
               i, (WPOS_NAME)[i],
               bmdef->cd_tree[i].n_down, bmdef->cd_tree[i].c.down);
#endif

        /* Now we can build the rest of the tree. */
        for (j = 0; j < mdef->n_ciphone; ++j) {
            ph_lc_t *lc;

            bmdef->cd_tree[ci_idx].ctx = j;
            bmdef->cd_tree[ci_idx].c.down = lc_idx;
            for (lc = mdef->wpos_ci_lclist[i][j]; lc; lc = lc->next) {
                ph_rc_t *rc;

                bmdef->cd_tree[lc_idx].ctx = lc->lc;
                bmdef->cd_tree[lc_idx].c.down = rc_idx;
                for (rc = lc->rclist; rc; rc = rc->next) {
                    bmdef->cd_tree[rc_idx].ctx = rc->rc;
                    bmdef->cd_tree[rc_idx].n_down = 0;
                    bmdef->cd_tree[rc_idx].c.pid = rc->pid;
#if 0
                    E_INFO("%d => %s %s %s %c (%d@%d)\n",
                           rc_idx,
                           bmdef->ciname[j],
                           bmdef->ciname[lc->lc],
                           bmdef->ciname[rc->rc],
                           (WPOS_NAME)[i],
                           bmdef->cd_tree[rc_idx].n_down,
                           bmdef->cd_tree[rc_idx].c.down);
#endif

                    ++bmdef->cd_tree[lc_idx].n_down;
                    ++rc_idx;
                }
                /* If there are no triphones here,
                 * this is considered a leafnode, so
                 * set the pid to -1. */
                if (bmdef->cd_tree[lc_idx].n_down == 0)
                    bmdef->cd_tree[lc_idx].c.pid = -1;
#if 0
                E_INFO("%d => %s %s %c (%d@%d)\n",
                       lc_idx,
                       bmdef->ciname[j],
                       bmdef->ciname[lc->lc],
                       (WPOS_NAME)[i],
                       bmdef->cd_tree[lc_idx].n_down,
                       bmdef->cd_tree[lc_idx].c.down);
#endif

                ++bmdef->cd_tree[ci_idx].n_down;
                ++lc_idx;
            }

            /* As above, so below. */
            if (bmdef->cd_tree[ci_idx].n_down == 0)
                bmdef->cd_tree[ci_idx].c.pid = -1;
#if 0
            E_INFO("%d => %d=%s (%d@%d)\n",
                   ci_idx, j, bmdef->ciname[j],
                   bmdef->cd_tree[ci_idx].n_down,
                   bmdef->cd_tree[ci_idx].c.down);
#endif

            ++ci_idx;
        }
    }

    mdef_free(mdef);

    bmdef->alloc_mode = BIN_MDEF_FROM_TEXT;
    return bmdef;
}